

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O1

void __thiscall
stackjit::ClassMetadataProvider::createVirtualFunctionTables
          (ClassMetadataProvider *this,VMState *vmState)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  
  for (p_Var1 = (this->mClassesMetadata)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    bVar2 = ClassMetadata::makeVirtualFunctionTable((ClassMetadata *)(p_Var1 + 5));
    if (((bVar2) && ((vmState->config).enableDebug == true)) &&
       ((vmState->config).printVirtualFunctionTableLayout == true)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"V-table for ",0xc);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)p_Var1[5]._M_nxt,(long)p_Var1[6]._M_nxt);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      for (p_Var4 = (_Rb_tree_node_base *)p_Var1[0x22]._M_nxt;
          p_Var4 != (_Rb_tree_node_base *)(p_Var1 + 0x20);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var4[1]._M_color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[1]._M_parent,(long)p_Var4[1]._M_left);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void ClassMetadataProvider::createVirtualFunctionTables(const VMState& vmState) {
		for (auto& current : mClassesMetadata) {
			auto& currentClass = current.second;
			auto createdVTable = currentClass.makeVirtualFunctionTable();

			if (createdVTable && vmState.config.enableDebug && vmState.config.printVirtualFunctionTableLayout) {
				std::cout << "V-table for " << currentClass.name() << std::endl;

				for (auto& virtualFunc : currentClass.virtualFunctions()) {
					std::cout << virtualFunc.first << ": " << virtualFunc.second << std::endl;
				}

				std::cout << std::endl;
			}
		}
	}